

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_avx2.h
# Opt level: O2

void btf_32_avx2_type1(int32_t w0,int32_t w1,__m256i *in0,__m256i *in1,__m256i _r,int32_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i alVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  
  alVar1 = *in0;
  alVar2 = *in1;
  auVar6._4_4_ = w0;
  auVar6._0_4_ = w0;
  auVar6._8_4_ = w0;
  auVar6._12_4_ = w0;
  auVar6._16_4_ = w0;
  auVar6._20_4_ = w0;
  auVar6._24_4_ = w0;
  auVar6._28_4_ = w0;
  auVar7._4_4_ = w1;
  auVar7._0_4_ = w1;
  auVar7._8_4_ = w1;
  auVar7._12_4_ = w1;
  auVar7._16_4_ = w1;
  auVar7._20_4_ = w1;
  auVar7._24_4_ = w1;
  auVar7._28_4_ = w1;
  auVar3 = vpmulld_avx2((undefined1  [32])alVar1,auVar6);
  auVar4 = vpmulld_avx2((undefined1  [32])alVar2,auVar7);
  auVar3 = vpaddd_avx2(auVar3,in_ZMM0._0_32_);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  alVar5 = (__m256i)vpsrad_avx2(auVar3,ZEXT416((uint)cos_bit));
  *in0 = alVar5;
  auVar3 = vpmulld_avx2((undefined1  [32])alVar2,auVar6);
  auVar4 = vpmulld_avx2(auVar7,(undefined1  [32])alVar1);
  auVar4 = vpsubd_avx2(in_ZMM0._0_32_,auVar4);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  alVar1 = (__m256i)vpsrad_avx2(auVar3,ZEXT416((uint)cos_bit));
  *in1 = alVar1;
  return;
}

Assistant:

static inline void btf_32_avx2_type1(const int32_t w0, const int32_t w1,
                                     __m256i *in0, __m256i *in1,
                                     const __m256i _r, const int32_t cos_bit) {
  __m256i _in0 = *in0;
  __m256i _in1 = *in1;
  const __m256i ww0 = _mm256_set1_epi32(w0);
  const __m256i ww1 = _mm256_set1_epi32(w1);
  const __m256i in0_w0 = _mm256_mullo_epi32(_in0, ww0);
  const __m256i in1_w1 = _mm256_mullo_epi32(_in1, ww1);
  __m256i temp0 = _mm256_add_epi32(in0_w0, in1_w1);
  temp0 = _mm256_add_epi32(temp0, _r);
  *in0 = _mm256_srai_epi32(temp0, cos_bit);
  const __m256i in0_w1 = _mm256_mullo_epi32(_in0, ww1);
  const __m256i in1_w0 = _mm256_mullo_epi32(_in1, ww0);
  __m256i temp1 = _mm256_sub_epi32(in1_w0, in0_w1);
  temp1 = _mm256_add_epi32(temp1, _r);
  *in1 = _mm256_srai_epi32(temp1, cos_bit);
}